

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O3

void __thiscall
t_swift_generator::generate_swift_struct_init
          (t_swift_generator *this,ostream *out,t_struct *tstruct,bool all,bool is_private)

{
  t_type *ttype;
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  ostream *poVar4;
  char *pcVar5;
  pointer pptVar6;
  undefined7 in_register_00000081;
  char *__s;
  string visibility;
  string local_b0;
  string local_90;
  char *local_70;
  long local_68;
  char local_60 [16];
  string local_50;
  
  pcVar5 = "fileprivate";
  if ((this->gen_cocoa_ & 1U) != 0) {
    pcVar5 = "private";
  }
  __s = "public";
  if ((int)CONCAT71(in_register_00000081,is_private) != 0) {
    __s = pcVar5;
  }
  local_70 = local_60;
  sVar3 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,__s,__s + sVar3);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_70,local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," init(",6);
  pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar6 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar2 = true;
    do {
      if (all) {
LAB_003562a4:
        if (!bVar2) {
          std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
        }
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,((*pptVar6)->name_)._M_dataplus._M_p,
                            ((*pptVar6)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
        ttype = (*pptVar6)->type_;
        bVar2 = field_is_optional(this,*pptVar6);
        type_name_abi_cxx11_(&local_b0,this,ttype,bVar2,false);
        maybe_escape_identifier(&local_90,this,&local_b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,local_90._M_dataplus._M_p,local_90._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        bVar2 = false;
      }
      else {
        bVar1 = field_is_optional(this,*pptVar6);
        if (!bVar1) goto LAB_003562a4;
      }
      pptVar6 = pptVar6 + 1;
    } while (pptVar6 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  block_open(this,out);
  pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar6 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      if (this->gen_cocoa_ == false) {
        if (!all) {
          bVar2 = field_is_optional(this,*pptVar6);
          if (bVar2) goto LAB_00356599;
        }
        t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_90._M_dataplus._M_p,local_90._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"self.",5);
        maybe_escape_identifier(&local_b0,this,&(*pptVar6)->name_);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
        maybe_escape_identifier(&local_50,this,&(*pptVar6)->name_);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
LAB_0035655f:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
      }
      else if ((all) || (((*pptVar6)->req_ & ~T_OPT_IN_REQ_OUT) == T_REQUIRED)) {
        t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_90._M_dataplus._M_p,local_90._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"self.",5);
        maybe_escape_identifier(&local_b0,this,&(*pptVar6)->name_);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
        maybe_escape_identifier(&local_50,this,&(*pptVar6)->name_);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        goto LAB_0035655f;
      }
LAB_00356599:
      pptVar6 = pptVar6 + 1;
    } while (pptVar6 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  block_close(this,out,true);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void t_swift_generator::generate_swift_struct_init(ostream& out,
                                                   t_struct* tstruct,
                                                   bool all,
                                                   bool is_private) {

  string visibility = is_private ? (gen_cocoa_ ? "private" : "fileprivate") : "public";

  indent(out) << visibility << " init(";

  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  bool first=true;
  for (m_iter = members.begin(); m_iter != members.end();) {
    if (all || !field_is_optional(*m_iter)) {
      if (first) {
        first = false;
      }
      else {
        out << ", ";
      }
      out << (*m_iter)->get_name() << ": "
          << maybe_escape_identifier(type_name((*m_iter)->get_type(), field_is_optional(*m_iter)));
    }
    ++m_iter;
  }
  out << ")";

  block_open(out);

  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    if (!gen_cocoa_) {
      bool should_set = all;
      should_set = should_set || !field_is_optional((*m_iter));
      if (should_set) {
        out << indent() << "self." << maybe_escape_identifier((*m_iter)->get_name()) << " = "
            << maybe_escape_identifier((*m_iter)->get_name()) << endl;
      }
    } else {
      /** legacy Swift2/Cocoa */
      if (all || (*m_iter)->get_req() == t_field::T_REQUIRED || (*m_iter)->get_req() == t_field::T_OPT_IN_REQ_OUT) {
        out << indent() << "self." << maybe_escape_identifier((*m_iter)->get_name()) << " = "
            << maybe_escape_identifier((*m_iter)->get_name()) << endl;
      }
    }
  }

  block_close(out);

  out << endl;
}